

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O2

SubroutineSymbol *
slang::ast::SubroutineSymbol::createFromPrototype
          (Compilation *compilation,MethodPrototypeSymbol *prototype,Scope *parent)

{
  uint in_EAX;
  SubroutineSymbol *pSVar1;
  __extent_storage<18446744073709551615UL> args_3;
  span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> sVar2;
  undefined8 uStack_28;
  
  args_3._M_extent_value = (long)&uStack_28 + 4;
  uStack_28 = (ulong)in_EAX;
  pSVar1 = BumpAllocator::
           emplace<slang::ast::SubroutineSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>const&,slang::SourceLocation_const&,slang::ast::VariableLifetime,slang::ast::SubroutineKind_const&>
                     (&compilation->super_BumpAllocator,compilation,&(prototype->super_Symbol).name,
                      &(prototype->super_Symbol).location,(VariableLifetime *)args_3._M_extent_value
                      ,&prototype->subroutineKind);
  (pSVar1->super_Symbol).parentScope = parent;
  (pSVar1->super_Symbol).indexInScope = 0x7fffffff;
  DeclaredType::setLink(&pSVar1->declaredReturnType,&prototype->declaredReturnType);
  pSVar1->visibility = prototype->visibility;
  (pSVar1->flags).m_bits = (prototype->flags).m_bits;
  sVar2._M_extent._M_extent_value = args_3._M_extent_value;
  sVar2._M_ptr = (pointer)(prototype->arguments)._M_extent._M_extent_value;
  sVar2 = cloneArguments((ast *)compilation,(Compilation *)&pSVar1->super_Scope,
                         (Scope *)(prototype->arguments)._M_ptr,sVar2);
  (pSVar1->arguments)._M_ptr = sVar2._M_ptr;
  (pSVar1->arguments)._M_extent =
       (__extent_storage<18446744073709551615UL>)sVar2._M_extent._M_extent_value;
  pSVar1->prototype = prototype;
  return pSVar1;
}

Assistant:

SubroutineSymbol& SubroutineSymbol::createFromPrototype(Compilation& compilation,
                                                        const MethodPrototypeSymbol& prototype,
                                                        const Scope& parent) {
    // Create a stub subroutine symbol that exists only to allow the normal expression
    // machinery to call it (checking argument types, return values, etc).
    auto result = compilation.emplace<SubroutineSymbol>(compilation, prototype.name,
                                                        prototype.location,
                                                        VariableLifetime::Automatic,
                                                        prototype.subroutineKind);

    result->setParent(parent, SymbolIndex(INT32_MAX));
    result->declaredReturnType.setLink(prototype.declaredReturnType);
    result->visibility = prototype.visibility;
    result->flags = prototype.flags;
    result->arguments = cloneArguments(compilation, *result, prototype.getArguments());
    result->prototype = &prototype;
    return *result;
}